

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O0

nng_stat * nng_stat_find(nng_stat *stat,char *name)

{
  int iVar1;
  nng_stat *pnVar2;
  nng_stat *result;
  nng_stat *child;
  char *name_local;
  nng_stat *stat_local;
  
  if (stat == (nng_stat *)0x0) {
    stat_local = (nng_stat *)0x0;
  }
  else {
    iVar1 = strcmp(name,stat->s_info->si_name);
    stat_local = stat;
    if (iVar1 != 0) {
      for (result = (nng_stat *)nni_list_first(&stat->s_children); result != (nng_stat *)0x0;
          result = (nng_stat *)nni_list_next(&stat->s_children,result)) {
        pnVar2 = nng_stat_find(result,name);
        if (pnVar2 != (nng_stat *)0x0) {
          return pnVar2;
        }
      }
      stat_local = (nng_stat *)0x0;
    }
  }
  return stat_local;
}

Assistant:

const nng_stat *
nng_stat_find(const nng_stat *stat, const char *name)
{
#if NNG_ENABLE_STATS
	const nng_stat *child;
	if (stat == NULL) {
		return (NULL);
	}
	if (strcmp(name, stat->s_info->si_name) == 0) {
		return (stat);
	}
	NNI_LIST_FOREACH (&stat->s_children, child) {
		const nng_stat *result;
		if ((result = nng_stat_find(child, name)) != NULL) {
			return (result);
		}
	}
#else
	NNI_ARG_UNUSED(stat);
	NNI_ARG_UNUSED(name);
#endif
	return (NULL);
}